

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O0

void mk_utils_gmt_cache_add(char *data,time_t time)

{
  void *pvVar1;
  mk_gmt_cache *gcache;
  uint min;
  uint i;
  time_t time_local;
  char *data_local;
  
  gcache._0_4_ = 0;
  pvVar1 = pthread_getspecific(mk_tls_cache_gmtext);
  for (gcache._4_4_ = 1; gcache._4_4_ < 10; gcache._4_4_ = gcache._4_4_ + 1) {
    if (*(ulong *)((long)pvVar1 + (ulong)gcache._4_4_ * 0x30 + 0x28) <
        *(ulong *)((long)pvVar1 + (ulong)(uint)gcache * 0x30 + 0x28)) {
      gcache._0_4_ = gcache._4_4_;
    }
  }
  *(undefined8 *)((long)pvVar1 + (ulong)(uint)gcache * 0x30 + 0x28) = 1;
  *(time_t *)((long)pvVar1 + (ulong)(uint)gcache * 0x30) = time;
  *(undefined8 *)((long)pvVar1 + (ulong)(uint)gcache * 0x30 + 8) = *(undefined8 *)data;
  *(undefined8 *)((long)pvVar1 + (ulong)(uint)gcache * 0x30 + 0x10) = *(undefined8 *)(data + 8);
  *(undefined8 *)((long)pvVar1 + (ulong)(uint)gcache * 0x30 + 0x18) = *(undefined8 *)(data + 0x10);
  *(undefined8 *)((long)pvVar1 + (ulong)(uint)gcache * 0x30 + 0x20) = *(undefined8 *)(data + 0x18);
  return;
}

Assistant:

static void mk_utils_gmt_cache_add(char *data, time_t time)
{
    unsigned int i, min = 0;
    struct mk_gmt_cache *gcache = MK_TLS_GET(mk_tls_cache_gmtext);

    for (i = 1; i < MK_GMT_CACHES; i++) {
        if (gcache[i].hits < gcache[min].hits)
            min = i;
    }

    gcache[min].hits = 1;
    gcache[min].time = time;
    memcpy(gcache[min].text, data, 32);
}